

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ActivationSigmoid * __thiscall
CoreML::Specification::ActivationParams::mutable_sigmoid(ActivationParams *this)

{
  bool bVar1;
  ActivationSigmoid *this_00;
  ActivationParams *this_local;
  
  bVar1 = has_sigmoid(this);
  if (!bVar1) {
    clear_NonlinearityType(this);
    set_has_sigmoid(this);
    this_00 = (ActivationSigmoid *)operator_new(0x18);
    ActivationSigmoid::ActivationSigmoid(this_00);
    (this->NonlinearityType_).sigmoid_ = this_00;
  }
  return (ActivationSigmoid *)(this->NonlinearityType_).linear_;
}

Assistant:

inline ::CoreML::Specification::ActivationSigmoid* ActivationParams::mutable_sigmoid() {
  if (!has_sigmoid()) {
    clear_NonlinearityType();
    set_has_sigmoid();
    NonlinearityType_.sigmoid_ = new ::CoreML::Specification::ActivationSigmoid;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ActivationParams.sigmoid)
  return NonlinearityType_.sigmoid_;
}